

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerResults.cpp
# Opt level: O1

void __thiscall
JtagAnalyzerResults::GenerateExportFile
          (JtagAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  size_t sVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  ulonglong uVar7;
  ulong uVar8;
  TdiTdoStringFormat format;
  JtagAnalyzerResults *pJVar9;
  _Base_ptr p_Var10;
  char *pcVar11;
  string tdo_str;
  string tdi_str;
  string tdo_count_str;
  string tdi_count_str;
  Frame frm;
  JtagShiftedData sd;
  ofstream file_stream;
  char time_str [128];
  JtagAnalyzerResults *local_3f8;
  DisplayBase local_3ec;
  ulonglong local_3e8;
  uint local_3dc;
  string local_3d8;
  undefined2 local_3b8;
  ulonglong local_3b0;
  char *local_3a8;
  long local_3a0;
  char local_398 [16];
  char *local_388;
  long local_380;
  char local_378 [16];
  char *local_368;
  long local_360;
  char local_358 [16];
  char *local_348;
  long local_340;
  char local_338 [16];
  _Base_ptr local_328;
  ulonglong local_320;
  pointer local_318;
  size_type sStack_310;
  size_type local_308;
  undefined8 uStack_300;
  undefined2 local_2f8;
  pointer local_2f0;
  void *local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  void *pvStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  long local_2b8;
  filebuf local_2b0 [240];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_3ec = display_base;
  std::ofstream::ofstream(&local_2b8,file,_S_out);
  local_320 = Analyzer::GetTriggerSample();
  local_3dc = Analyzer::GetSampleRate();
  if (this->mSettings->mShowBitCount == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"Time [s];TAP state;TDI;TDO;TDIBitCount;TDOBitCount",0x32);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b8,"Time [s];TAP state;TDI;TDO",0x1a);
  }
  std::ios::widen((char)&local_2b8 + (char)*(undefined8 *)(local_2b8 + -0x18));
  std::ostream::put((char)local_2b0 + -8);
  std::ostream::flush();
  Frame::Frame((Frame *)&local_318);
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  pvStack_2d0 = (void *)0x0;
  local_2e8 = (void *)0x0;
  uStack_2e0 = 0;
  local_388 = local_378;
  local_380 = 0;
  local_378[0] = '\0';
  local_3a8 = local_398;
  local_3a0 = 0;
  local_398[0] = '\0';
  local_348 = local_338;
  local_340 = 0;
  local_338[0] = '\0';
  local_368 = local_358;
  local_360 = 0;
  local_358[0] = '\0';
  local_3f8 = this;
  local_3e8 = AnalyzerResults::GetNumFrames();
  if (local_3e8 != 0) {
    local_328 = &(local_3f8->mShiftedData)._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar7 = 0;
    do {
      pJVar9 = local_3f8;
      local_3b0 = uVar7;
      AnalyzerResults::GetFrame((ulonglong)&local_3d8);
      local_2f8 = local_3b8;
      local_308 = local_3d8.field_2._M_allocated_capacity;
      uStack_300 = local_3d8.field_2._8_8_;
      local_318 = local_3d8._M_dataplus._M_p;
      sStack_310 = local_3d8._M_string_length;
      Frame::~Frame((Frame *)&local_3d8);
      format = 0x80;
      AnalyzerHelpers::GetTimeString((ulonglong)local_318,local_320,local_3dc,local_b8,0x80);
      bVar2 = (byte)local_2f8;
      uVar8 = (ulong)(byte)local_2f8;
      local_380 = 0;
      *local_388 = '\0';
      local_3a0 = 0;
      *local_3a8 = '\0';
      local_340 = 0;
      *local_348 = '\0';
      local_360 = 0;
      *local_368 = '\0';
      if ((bVar2 == 0xb) || (bVar2 == 4)) {
        local_2f0 = local_318;
        p_Var6 = local_328;
        for (p_Var10 = (pJVar9->mShiftedData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ; p_Var10 != (_Base_ptr)0x0;
            p_Var10 = (&p_Var10->_M_left)[*(pointer *)(p_Var10 + 1) < local_318]) {
          if (*(pointer *)(p_Var10 + 1) >= local_318) {
            p_Var6 = p_Var10;
          }
        }
        p_Var10 = local_328;
        if ((p_Var6 != local_328) && (p_Var10 = p_Var6, local_318 < *(pointer *)(p_Var6 + 1))) {
          p_Var10 = local_328;
        }
        if (p_Var10 != local_328) {
          JtagShiftedData::GetStringFromBitStates_abi_cxx11_
                    (&local_3d8,(JtagShiftedData *)&p_Var10[1]._M_parent,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)local_3ec,
                     Decimal,format);
          std::__cxx11::string::operator=((string *)&local_388,(string *)&local_3d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p);
          }
          JtagShiftedData::GetStringFromBitStates_abi_cxx11_
                    (&local_3d8,(JtagShiftedData *)(p_Var10 + 2),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)local_3ec,
                     Decimal,format);
          std::__cxx11::string::operator=((string *)&local_3a8,(string *)&local_3d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p);
          }
          pJVar9 = local_3f8;
          if (local_3f8->mSettings->mShowBitCount == true) {
            JtagShiftedData::GetTDILengthString_abi_cxx11_
                      (&local_3d8,(JtagShiftedData *)(p_Var10 + 1),false);
            std::__cxx11::string::operator=((string *)&local_348,(string *)&local_3d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p);
            }
            JtagShiftedData::GetTDOLengthString_abi_cxx11_
                      (&local_3d8,(JtagShiftedData *)(p_Var10 + 1),false);
            std::__cxx11::string::operator=((string *)&local_368,(string *)&local_3d8);
            pJVar9 = local_3f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p);
              pJVar9 = local_3f8;
            }
          }
        }
      }
      bVar1 = pJVar9->mSettings->mShowBitCount;
      sVar4 = strlen(local_b8);
      if (bVar1 == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,local_b8,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,";",1);
        pcVar11 = "<undefined>";
        if (bVar2 < 0x10) {
          pcVar11 = TAPStateDescLong[uVar8];
        }
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)&local_3f8 + (int)*(undefined8 *)(local_2b8 + -0x18) + 0x140);
        }
        else {
          sVar4 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,pcVar11,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,";",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_2b8,local_388,local_380);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3a8,local_3a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_348,local_340);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_368,local_360);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,local_b8,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,";",1);
        pcVar11 = "<undefined>";
        if (bVar2 < 0x10) {
          pcVar11 = TAPStateDescLong[uVar8];
        }
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)&local_3f8 + (int)*(undefined8 *)(local_2b8 + -0x18) + 0x140);
        }
        else {
          sVar4 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,pcVar11,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,";",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_2b8,local_388,local_380);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3a8,local_3a0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      }
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)local_3f8,local_3b0)
      ;
      if (cVar3 != '\0') goto LAB_001098b2;
      uVar7 = local_3b0 + 1;
    } while (uVar7 != local_3e8);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)local_3f8,local_3e8);
LAB_001098b2:
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8);
  }
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  if (pvStack_2d0 != (void *)0x0) {
    operator_delete(pvStack_2d0);
  }
  if (local_2e8 != (void *)0x0) {
    operator_delete(local_2e8);
  }
  Frame::~Frame((Frame *)&local_318);
  local_2b8 = _VTT;
  *(undefined8 *)(local_2b0 + *(long *)(_VTT + -0x18) + -8) = _FrameV2;
  std::filebuf::~filebuf(local_2b0);
  std::ios_base::~ios_base(local_1c0);
  return;
}

Assistant:

void JtagAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    if( mSettings->mShowBitCount )
        file_stream << "Time [s];TAP state;TDI;TDO;TDIBitCount;TDOBitCount" << std::endl;
    else
        file_stream << "Time [s];TAP state;TDI;TDO" << std::endl;

    Frame frm;
    JtagShiftedData sd;
    std::set<JtagShiftedData>::iterator sdi;
    char time_str[ 128 ];
    std::string tdi_str, tdo_str, tdi_count_str, tdo_count_str;
    const U64 num_frames = GetNumFrames();
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        frm = GetFrame( fcnt );

        // make the time string
        AnalyzerHelpers::GetTimeString( frm.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, sizeof( time_str ) );

        // get the TAP state
        JtagTAPState tap_state = ( JtagTAPState )frm.mType;

        // make the TDI/TDO data if we're in a shift state
        tdi_str.clear();
        tdo_str.clear();
        tdi_count_str.clear();
        tdo_count_str.clear();
        if( tap_state == ShiftIR || tap_state == ShiftDR )
        {
            // find TDI/TDO data
            sd.mStartSampleIndex = frm.mStartingSampleInclusive;
            sdi = mShiftedData.find( sd );

            // found?
            if( sdi != mShiftedData.end() )
            {
                tdi_str = sdi->GetTDIString( display_base, JtagShiftedData::TdiTdoStringFormat::Break64 );
                tdo_str = sdi->GetTDOString( display_base, JtagShiftedData::TdiTdoStringFormat::Break64 );

                if( mSettings->mShowBitCount )
                {
                    tdi_count_str = sdi->GetTDILengthString( false );
                    tdo_count_str = sdi->GetTDOLengthString( false );
                }
            }
        }

        // output
        if( mSettings->mShowBitCount )
            file_stream << time_str << ";" << GetStateDescLong( tap_state ) << ";" << tdi_str << ";" << tdo_str << ";" << tdi_count_str
                        << ";" << tdo_count_str << std::endl;
        else
            file_stream << time_str << ";" << GetStateDescLong( tap_state ) << ";" << tdi_str << ";" << tdo_str << std::endl;

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}